

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void polyscope::view::updateFlight(void)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  double dVar4;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  vec<3,_float,_(glm::qualifier)0> vVar7;
  vec3 interpT;
  dualquat interpR;
  float tSmooth;
  float t;
  float in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffef4;
  vec3 *in_stack_fffffffffffffef8;
  vec<3,_float,_(glm::qualifier)0> *in_stack_ffffffffffffff00;
  undefined1 local_f8 [56];
  float *in_stack_ffffffffffffff40;
  tdualquat<float,_(glm::qualifier)0> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 local_40 [64];
  
  if ((midflight & 1) != 0) {
    dVar4 = ImGui::GetTime();
    if (dVar4 <= (double)flightEndTime) {
      dVar4 = ImGui::GetTime();
      fVar3 = (float)((dVar4 - (double)flightStartTime) / (double)(flightEndTime - flightStartTime))
      ;
      glm::smoothstep<float>
                (in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      glm::lerp<float,(glm::qualifier)0>
                ((tdualquat<float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      auVar6 = (undefined1  [56])0x0;
      vVar7 = glm::mix<3,float,float,(glm::qualifier)0>
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef4);
      auVar5._0_8_ = vVar7._0_8_;
      auVar5._8_56_ = auVar6;
      uVar1 = vmovlpd_avx(auVar5._0_16_);
      glm::mat3x4_cast<float,(glm::qualifier)0>
                ((tdualquat<float,_(glm::qualifier)0> *)
                 CONCAT44(vVar7.field_2,(int)((ulong)uVar1 >> 0x20)));
      buildTransform((mat3x4 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      memcpy(viewMat,local_f8,0x40);
      auVar2 = vfmadd213ss_fma(ZEXT416(flightInitialFov),ZEXT416((uint)(1.0 - fVar3)),
                               ZEXT416((uint)(fVar3 * flightTargetFov)));
      fVar3 = auVar2._0_4_;
    }
    else {
      midflight = 0;
      glm::mat3x4_cast<float,(glm::qualifier)0>
                ((tdualquat<float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      buildTransform((mat3x4 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      memcpy(viewMat,local_40,0x40);
      fVar3 = flightTargetFov;
    }
    fov = (double)fVar3;
    requestRedraw();
  }
  return;
}

Assistant:

void updateFlight() {
  if (midflight) {
    if (ImGui::GetTime() > flightEndTime) {
      // Flight is over, ensure we end exactly at target location
      midflight = false;
      viewMat = buildTransform(glm::mat3x4_cast(flightTargetViewR), flightTargetViewT);
      fov = flightTargetFov;
    } else {
      // normalized time for spline on [0,1]
      float t = (ImGui::GetTime() - flightStartTime) / (flightEndTime - flightStartTime);

      float tSmooth = glm::smoothstep(0.f, 1.f, t);

      // linear spline
      glm::dualquat interpR = glm::lerp(flightInitialViewR, flightTargetViewR, tSmooth);

      glm::vec3 interpT = glm::mix(flightInitialViewT, flightTargetViewT, tSmooth);

      viewMat = buildTransform(glm::mat3x4_cast(interpR), interpT);

      // linear spline
      fov = (1.0f - t) * flightInitialFov + t * flightTargetFov;
    }
    requestRedraw(); // flight is still happening, draw again next frame
  }
}